

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

config_value * parser_parse_array(parser *parser,char *string)

{
  undefined8 in_R9;
  undefined8 uVar1;
  config_value *config_value;
  char *value_item;
  size_t i;
  size_t value_items_length;
  char **value_items;
  size_t sStack_30;
  natwm_error err;
  size_t value_items_string_length;
  char *value_items_string;
  char *string_local;
  parser *parser_local;
  
  uVar1 = 0x1090c5;
  value_items_string_length = 0;
  sStack_30 = 0;
  value_items._4_4_ = 0x20;
  value_items_string = string;
  string_local = (char *)parser;
  value_items._4_4_ =
       array_find_value_items_string
                 (parser,string,(char **)&value_items_string_length,&stack0xffffffffffffffd0);
  if (value_items._4_4_ == NO_ERROR) {
    value_items_length = 0;
    i = 0;
    value_items._4_4_ =
         array_split_value_items_string
                   ((char *)value_items_string_length,(char ***)&value_items_length,&i);
    if (value_items._4_4_ == NO_ERROR) {
      value_items._4_4_ = NO_ERROR;
      for (value_item = (char *)0x0; value_item < i; value_item = value_item + 1) {
        config_value = (config_value *)0x0;
        value_items._4_4_ =
             string_strip_surrounding_spaces
                       (*(char **)(value_items_length + (long)value_item * 8),(char **)&config_value
                        ,(size_t *)0x0);
        if ((value_items._4_4_ == NOT_FOUND_ERROR) && (value_item == (char *)(i - 1))) {
          free(*(void **)(value_items_length + (long)value_item * 8));
          i = i - 1;
          break;
        }
        if (value_items._4_4_ != NO_ERROR) {
          internal_logger(natwm_logger,LEVEL_ERROR,
                          "Failed to parse array value item \'%s\' - Line %zu",
                          *(undefined8 *)(value_items_length + (long)value_item * 8),
                          *(undefined8 *)(string_local + 0x18),in_R9,uVar1);
          free((void *)value_items_string_length);
          free((void *)value_items_length);
          return (config_value *)0x0;
        }
        free(*(void **)(value_items_length + (long)value_item * 8));
        *(config_value **)(value_items_length + (long)value_item * 8) = config_value;
      }
      parser_local = (parser *)
                     parser_resolve_array_values
                               ((parser *)string_local,(char **)value_items_length,i);
      if (parser_local == (parser *)0x0) {
        free((void *)value_items_string_length);
        free((void *)value_items_length);
        parser_local = (parser *)0x0;
      }
      else {
        free(value_items_string);
        free((void *)value_items_string_length);
        free((void *)value_items_length);
      }
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to parse array value items string - Line %zu"
                      ,*(undefined8 *)(string_local + 0x18));
      free((void *)value_items_string_length);
      parser_local = (parser *)0x0;
    }
  }
  else {
    parser_local = (parser *)0x0;
  }
  return (config_value *)parser_local;
}

Assistant:

static struct config_value *parser_parse_array(struct parser *parser, char *string)
{
        char *value_items_string = NULL;
        size_t value_items_string_length = 0;
        enum natwm_error err = GENERIC_ERROR;

        err = array_find_value_items_string(
                parser, string, &value_items_string, &value_items_string_length);

        if (err != NO_ERROR) {
                return NULL;
        }

        // We should now have a valid string containing the string
        // representation of the array values
        //
        // We now need to normalize it
        char **value_items = NULL;
        size_t value_items_length = 0;

        err = array_split_value_items_string(value_items_string, &value_items, &value_items_length);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to parse array value items string - Line %zu",
                          parser->line_num);

                free(value_items_string);

                return NULL;
        }

        // Remove spaces around the items
        for (size_t i = 0; i < value_items_length; ++i) {
                char *value_item = NULL;
                err = string_strip_surrounding_spaces(value_items[i], &value_item, NULL);

                // If we encounter an '' (empty string) as the last item in the
                // array we have two senarios:
                //
                // 1) The array is empty and there are no values
                // 2) There was a trailing comma
                //
                // In both cases we should free the string, decrement the array
                // length, and terminate the loop
                if (err == NOT_FOUND_ERROR && (i == value_items_length - 1)) {
                        free(value_items[i]);

                        value_items_length -= 1;

                        break;
                }

                if (err != NO_ERROR) {
                        LOG_ERROR(natwm_logger,
                                  "Failed to parse array value item '%s' - "
                                  "Line %zu",
                                  value_items[i],
                                  parser->line_num);

                        goto free_and_error;
                }

                free(value_items[i]);

                value_items[i] = value_item;
        }

        // Now we should have an array of stripped items
        // Last step is to parse them into a new config_value
        struct config_value *config_value
                = parser_resolve_array_values(parser, value_items, value_items_length);

        if (config_value == NULL) {
                free(value_items_string);
                free(value_items);

                return NULL;
        }

        free(string);
        free(value_items_string);
        free(value_items);

        return config_value;

free_and_error:
        // We need to free up our intermediate strings and the array of array
        // values we allocated
        free(value_items_string);
        free(value_items);

        return NULL;
}